

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

void FACT_INTERNAL_ParseTrackEvents
               (uint8_t **ptr,uint8_t se,FACTTrack *track,FAudioMallocFunc pMalloc)

{
  code *pcVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  int16_t iVar5;
  uint32_t uVar6;
  int iVar7;
  undefined8 uVar8;
  code *in_RCX;
  long in_RDX;
  uint8_t in_SIL;
  uint8_t **in_RDI;
  float fVar9;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  uint16_t j;
  uint8_t i;
  uint8_t separator;
  uint8_t maxWeight;
  uint8_t minWeight;
  uint32_t evtInfo;
  ushort local_2a;
  byte local_28;
  
  uVar2 = read_u8(in_RDI);
  *(uint8_t *)(in_RDX + 0x18) = uVar2;
  uVar8 = (*in_RCX)((ulong)*(byte *)(in_RDX + 0x18) * 0x50);
  *(undefined8 *)(in_RDX + 0x20) = uVar8;
  SDL_memset(*(undefined8 *)(in_RDX + 0x20),0,(ulong)*(byte *)(in_RDX + 0x18) * 0x50);
  local_28 = 0;
  do {
    if (*(byte *)(in_RDX + 0x18) <= local_28) {
      return;
    }
    uVar6 = read_u32(in_RDI,in_SIL);
    uVar4 = read_u16(in_RDI,in_SIL);
    *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 4) = uVar4;
    *(ushort *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) = (ushort)uVar6 & 0x1f;
    *(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 2) = (short)(uVar6 >> 5);
    uVar2 = read_u8(in_RDI);
    do {
      if (uVar2 == 0xff) goto LAB_0011d93d;
      iVar7 = SDL_ReportAssertion(&FACT_INTERNAL_ParseTrackEvents::sdl_assert_data,
                                  "FACT_INTERNAL_ParseTrackEvents",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                  ,0x913);
    } while (iVar7 == 0);
    if (iVar7 == 1) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
LAB_0011d93d:
    if (*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 0) {
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 8) = uVar2;
    }
    else if (*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 1) {
      *(undefined1 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xe) = 0;
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 8) = uVar2;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x10) = uVar4;
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12) = uVar2;
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 9) = uVar2;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 10) = uVar4;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xc) = uVar4;
      *(undefined2 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x4c) = 0;
    }
    else if (*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 3) {
      *(undefined1 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xe) = 1;
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 8) = uVar2;
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 9) = uVar2;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 10) = uVar4;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xc) = uVar4;
      uVar6 = read_u32(in_RDI,in_SIL);
      *(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12) = (short)uVar6;
      *(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x10) = (short)(uVar6 >> 0x10);
      *in_RDI = *in_RDI + 4;
      uVar8 = (*in_RCX)((ulong)*(ushort *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12)
                        << 1);
      *(undefined8 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x18) = uVar8;
      uVar8 = (*in_RCX)(*(undefined2 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12));
      *(undefined8 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x20) = uVar8;
      uVar8 = (*in_RCX)(*(undefined2 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12));
      *(undefined8 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x28) = uVar8;
      for (local_2a = 0;
          local_2a < *(ushort *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12);
          local_2a = local_2a + 1) {
        uVar4 = read_u16(in_RDI,in_SIL);
        *(uint16_t *)
         (*(long *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x18) + (ulong)local_2a * 2)
             = uVar4;
        uVar2 = read_u8(in_RDI);
        *(uint8_t *)
         (*(long *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x20) + (ulong)local_2a) =
             uVar2;
        uVar2 = read_u8(in_RDI);
        uVar3 = read_u8(in_RDI);
        *(uint8_t *)
         (*(long *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x28) + (ulong)local_2a) =
             uVar3 - uVar2;
      }
      *(undefined2 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x4c) = 0;
    }
    else if (*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 4) {
      *(undefined1 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xe) = 0;
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 8) = uVar2;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x10) = uVar4;
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12) = uVar2;
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 9) = uVar2;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 10) = uVar4;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xc) = uVar4;
      iVar5 = read_s16(in_RDI,in_SIL);
      *(int16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x30) = iVar5;
      iVar5 = read_s16(in_RDI,in_SIL);
      *(int16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x32) = iVar5;
      fVar9 = read_volbyte((uint8_t **)0x11df68);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x34) = fVar9;
      fVar9 = read_volbyte((uint8_t **)0x11df8c);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x38) = fVar9;
      fVar9 = read_f32(in_RDI,in_SIL);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x3c) = fVar9;
      fVar9 = read_f32(in_RDI,in_SIL);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x40) = fVar9;
      fVar9 = read_f32(in_RDI,in_SIL);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x44) = fVar9;
      fVar9 = read_f32(in_RDI,in_SIL);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x48) = fVar9;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x4c) = uVar4;
    }
    else if (*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 6) {
      *(undefined1 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xe) = 1;
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 8) = uVar2;
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 9) = uVar2;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 10) = uVar4;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xc) = uVar4;
      iVar5 = read_s16(in_RDI,in_SIL);
      *(int16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x30) = iVar5;
      iVar5 = read_s16(in_RDI,in_SIL);
      *(int16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x32) = iVar5;
      fVar9 = read_volbyte((uint8_t **)0x11e1b2);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x34) = fVar9;
      fVar9 = read_volbyte((uint8_t **)0x11e1d6);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x38) = fVar9;
      fVar9 = read_f32(in_RDI,in_SIL);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x3c) = fVar9;
      fVar9 = read_f32(in_RDI,in_SIL);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x40) = fVar9;
      fVar9 = read_f32(in_RDI,in_SIL);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x44) = fVar9;
      fVar9 = read_f32(in_RDI,in_SIL);
      *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x48) = fVar9;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x4c) = uVar4;
      uVar6 = read_u32(in_RDI,in_SIL);
      *(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12) = (short)uVar6;
      *(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x10) = (short)(uVar6 >> 0x10);
      *in_RDI = *in_RDI + 4;
      uVar8 = (*in_RCX)((ulong)*(ushort *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12)
                        << 1);
      *(undefined8 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x18) = uVar8;
      uVar8 = (*in_RCX)(*(undefined2 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12));
      *(undefined8 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x20) = uVar8;
      uVar8 = (*in_RCX)(*(undefined2 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12));
      *(undefined8 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x28) = uVar8;
      for (local_2a = 0;
          local_2a < *(ushort *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x12);
          local_2a = local_2a + 1) {
        uVar4 = read_u16(in_RDI,in_SIL);
        *(uint16_t *)
         (*(long *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x18) + (ulong)local_2a * 2)
             = uVar4;
        uVar2 = read_u8(in_RDI);
        *(uint8_t *)
         (*(long *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x20) + (ulong)local_2a) =
             uVar2;
        uVar2 = read_u8(in_RDI);
        uVar3 = read_u8(in_RDI);
        *(uint8_t *)
         (*(long *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x28) + (ulong)local_2a) =
             uVar3 - uVar2;
      }
    }
    else if ((((*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 7) ||
              (*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 8)) ||
             (*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 0x10)) ||
            (*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 0x11)) {
      uVar2 = read_u8(in_RDI);
      *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 8) = uVar2;
      if ((*(byte *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 8) & 1) == 0) {
        uVar2 = read_u8(in_RDI);
        *(uint8_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x10) = uVar2;
        do {
          if ((*(byte *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x10) & 0xc) != 0)
          goto LAB_0011e700;
          iVar7 = SDL_ReportAssertion(&FACT_INTERNAL_ParseTrackEvents::sdl_assert_data_1,
                                      "FACT_INTERNAL_ParseTrackEvents",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                      ,0x9a9);
        } while (iVar7 == 0);
        if (iVar7 == 1) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
LAB_0011e700:
        fVar9 = read_f32(in_RDI,in_SIL);
        *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x14) = fVar9;
        fVar9 = read_f32(in_RDI,in_SIL);
        *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x18) = fVar9;
        *in_RDI = *in_RDI + 5;
        if ((*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 0x10) ||
           (*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 0x11)) {
          uVar4 = read_u16(in_RDI,in_SIL);
          *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 10) = uVar4;
          uVar4 = read_u16(in_RDI,in_SIL);
          *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xc) = uVar4;
        }
        else {
          *(undefined2 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 10) = 0;
        }
      }
      else {
        *(undefined2 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 10) = 0;
        fVar9 = read_f32(in_RDI,in_SIL);
        *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x10) = fVar9;
        fVar9 = read_f32(in_RDI,in_SIL);
        *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x14) = fVar9 * 100.0;
        fVar9 = read_f32(in_RDI,in_SIL);
        *(float *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x18) = fVar9;
        uVar4 = read_u16(in_RDI,in_SIL);
        *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0x1c) = uVar4;
      }
    }
    else if (*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 9) {
      uVar6 = read_u32(in_RDI,in_SIL);
      *(uint32_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 8) = uVar6;
      *(undefined2 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xc) = 0;
      *(undefined2 *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xe) = 0;
    }
    else if (*(short *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50) == 0x12) {
      uVar6 = read_u32(in_RDI,in_SIL);
      *(uint32_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 8) = uVar6;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xc) = uVar4;
      uVar4 = read_u16(in_RDI,in_SIL);
      *(uint16_t *)(*(long *)(in_RDX + 0x20) + (ulong)local_28 * 0x50 + 0xe) = uVar4;
    }
    else {
      do {
        iVar7 = SDL_ReportAssertion(&FACT_INTERNAL_ParseTrackEvents::sdl_assert_data_2,
                                    "FACT_INTERNAL_ParseTrackEvents",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                    ,0x9ca);
      } while (iVar7 == 0);
      if (iVar7 == 1) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void FACT_INTERNAL_ParseTrackEvents(
	uint8_t **ptr,
	uint8_t se,
	FACTTrack *track,
	FAudioMallocFunc pMalloc
) {
	uint32_t evtInfo;
	uint8_t minWeight, maxWeight, separator;
	uint8_t i;
	uint16_t j;

	track->eventCount = read_u8(ptr);
	track->events = (FACTEvent*) pMalloc(
		sizeof(FACTEvent) *
		track->eventCount
	);
	FAudio_zero(track->events, sizeof(FACTEvent) * track->eventCount);
	for (i = 0; i < track->eventCount; i += 1)
	{
		evtInfo = read_u32(ptr, se);
		track->events[i].randomOffset = read_u16(ptr, se);

		track->events[i].type = evtInfo & 0x001F;
		track->events[i].timestamp = (evtInfo >> 5) & 0xFFFF;

		separator = read_u8(ptr);
		FAudio_assert(separator == 0xFF); /* Separator? */

		#define EVTTYPE(t) (track->events[i].type == t)
		if (EVTTYPE(FACTEVENT_STOP))
		{
			track->events[i].stop.flags = read_u8(ptr);
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVE))
		{
			/* Basic Wave */
			track->events[i].wave.isComplex = 0;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.simple.track = read_u16(ptr, se);
			track->events[i].wave.simple.wavebank = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* No Effect Variation */
			track->events[i].wave.variationFlags = 0;
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVETRACKVARIATION))
		{
			/* Complex Wave */
			track->events[i].wave.isComplex = 1;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* Track Variation */
			evtInfo = read_u32(ptr, se);
			track->events[i].wave.complex.trackCount = evtInfo & 0xFFFF;
			track->events[i].wave.complex.variation = (evtInfo >> 16) & 0xFFFF;
			*ptr += 4; /* Unknown values */
			track->events[i].wave.complex.tracks = (uint16_t*) pMalloc(
				sizeof(uint16_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.wavebanks = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.weights = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			for (j = 0; j < track->events[i].wave.complex.trackCount; j += 1)
			{
				track->events[i].wave.complex.tracks[j] = read_u16(ptr, se);
				track->events[i].wave.complex.wavebanks[j] = read_u8(ptr);
				minWeight = read_u8(ptr);
				maxWeight = read_u8(ptr);
				track->events[i].wave.complex.weights[j] = (
					maxWeight - minWeight
				);
			}

			/* No Effect Variation */
			track->events[i].wave.variationFlags = 0;
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVEEFFECTVARIATION))
		{
			/* Basic Wave */
			track->events[i].wave.isComplex = 0;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.simple.track = read_u16(ptr, se);
			track->events[i].wave.simple.wavebank = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* Effect Variation */
			track->events[i].wave.minPitch = read_s16(ptr, se);
			track->events[i].wave.maxPitch = read_s16(ptr, se);
			track->events[i].wave.minVolume = read_volbyte(ptr);
			track->events[i].wave.maxVolume = read_volbyte(ptr);
			track->events[i].wave.minFrequency = read_f32(ptr, se);
			track->events[i].wave.maxFrequency = read_f32(ptr, se);
			track->events[i].wave.minQFactor = read_f32(ptr, se);
			track->events[i].wave.maxQFactor = read_f32(ptr, se);
			track->events[i].wave.variationFlags = read_u16(ptr, se);
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVETRACKEFFECTVARIATION))
		{
			/* Complex Wave */
			track->events[i].wave.isComplex = 1;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* Effect Variation */
			track->events[i].wave.minPitch = read_s16(ptr, se);
			track->events[i].wave.maxPitch = read_s16(ptr, se);
			track->events[i].wave.minVolume = read_volbyte(ptr);
			track->events[i].wave.maxVolume = read_volbyte(ptr);
			track->events[i].wave.minFrequency = read_f32(ptr, se);
			track->events[i].wave.maxFrequency = read_f32(ptr, se);
			track->events[i].wave.minQFactor = read_f32(ptr, se);
			track->events[i].wave.maxQFactor = read_f32(ptr, se);
			track->events[i].wave.variationFlags = read_u16(ptr, se);

			/* Track Variation */
			evtInfo = read_u32(ptr, se);
			track->events[i].wave.complex.trackCount = evtInfo & 0xFFFF;
			track->events[i].wave.complex.variation = (evtInfo >> 16) & 0xFFFF;
			*ptr += 4; /* Unknown values */
			track->events[i].wave.complex.tracks = (uint16_t*) pMalloc(
				sizeof(uint16_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.wavebanks = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.weights = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			for (j = 0; j < track->events[i].wave.complex.trackCount; j += 1)
			{
				track->events[i].wave.complex.tracks[j] = read_u16(ptr, se);
				track->events[i].wave.complex.wavebanks[j] = read_u8(ptr);
				minWeight = read_u8(ptr);
				maxWeight = read_u8(ptr);
				track->events[i].wave.complex.weights[j] = (
					maxWeight - minWeight
				);
			}
		}
		else if (	EVTTYPE(FACTEVENT_PITCH) ||
				EVTTYPE(FACTEVENT_VOLUME) ||
				EVTTYPE(FACTEVENT_PITCHREPEATING) ||
				EVTTYPE(FACTEVENT_VOLUMEREPEATING)	)
		{
			track->events[i].value.settings = read_u8(ptr);
			if (track->events[i].value.settings & 1) /* Ramp */
			{
				track->events[i].value.repeats = 0;
				track->events[i].value.ramp.initialValue = read_f32(ptr, se);
				track->events[i].value.ramp.initialSlope = read_f32(ptr, se) * 100;
				track->events[i].value.ramp.slopeDelta = read_f32(ptr, se);
				track->events[i].value.ramp.duration = read_u16(ptr, se);
			}
			else /* Equation */
			{
				track->events[i].value.equation.flags = read_u8(ptr);

				/* SetValue, SetRandomValue, anything else? */
				FAudio_assert(track->events[i].value.equation.flags & 0x0C);

				track->events[i].value.equation.value1 = read_f32(ptr, se);
				track->events[i].value.equation.value2 = read_f32(ptr, se);

				*ptr += 5; /* Unknown values */

				if (	EVTTYPE(FACTEVENT_PITCHREPEATING) ||
					EVTTYPE(FACTEVENT_VOLUMEREPEATING)	)
				{
					track->events[i].value.repeats = read_u16(ptr, se);
					track->events[i].value.frequency = read_u16(ptr, se);
				}
				else
				{
					track->events[i].value.repeats = 0;
				}
			}
		}
		else if (EVTTYPE(FACTEVENT_MARKER))
		{
			track->events[i].marker.marker = read_u32(ptr, se);
			track->events[i].marker.repeats = 0;
			track->events[i].marker.frequency = 0;
		}
		else if (EVTTYPE(FACTEVENT_MARKERREPEATING))
		{
			track->events[i].marker.marker = read_u32(ptr, se);
			track->events[i].marker.repeats = read_u16(ptr, se);
			track->events[i].marker.frequency = read_u16(ptr, se);
		}
		else
		{
			FAudio_assert(0 && "Unknown event type!");
		}
		#undef EVTTYPE
	}
}